

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O2

void __thiscall CTcParser::build_dictionaries(CTcParser *this)

{
  CVmHashEntry *pCVar1;
  CTcDictEntry *dict;
  CTcDictEntry **ppCVar2;
  CVmHashEntry **ppCVar3;
  
  CTcPrsSymtab::enum_entries(this->global_symtab_,enum_sym_dict,this);
  ppCVar3 = (CVmHashEntry **)&this->anon_obj_head_;
  while (pCVar1 = *ppCVar3, pCVar1 != (CVmHashEntry *)0x0) {
    (*(((CTcSymObjBase *)&pCVar1->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x11])(pCVar1);
    ppCVar3 = &pCVar1->nxt_;
  }
  ppCVar2 = &this->dict_head_;
  while (dict = *ppCVar2, dict != (CTcDictEntry *)0x0) {
    CTcGenTarg::gen_code_for_dict(G_cg,dict);
    ppCVar2 = &dict->nxt_;
  }
  return;
}

Assistant:

void CTcParser::build_dictionaries()
{
    CTcDictEntry *dict;
    CTcSymObj *sym;
    
    /* 
     *   enumerate our symbols to insert dictionary words - this will
     *   populate each dictionary's hash table with a complete list of the
     *   words and object associations for the dictionary 
     */
    get_global_symtab()->enum_entries(&enum_sym_dict, this);

    /* do the same for the anonymous objects */
    for (sym = anon_obj_head_ ; sym != 0 ; sym = (CTcSymObj *)sym->nxt_)
        sym->build_dictionary();

    /* generate the object stream for each dictionary */
    for (dict = dict_head_ ; dict != 0 ; dict = dict->get_next())
    {
        /* generate the code (static data, actually) for this dictionary */
        G_cg->gen_code_for_dict(dict);
    }
}